

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Int_t * Gia_ManCollectOneSide(Gia_Man_t *p,int iSide)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Vec_Int_t *vNodes;
  int *piVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  long lVar7;
  
  iVar2 = p->nObjs;
  uVar6 = ~(p->vCos->nSize + p->vCis->nSize);
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < (iVar2 + uVar6) - 1) {
    iVar4 = iVar2 + uVar6;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  vNodes->pArray = piVar3;
  Gia_ManIncrementTravId(p);
  iVar2 = p->nRegs;
  pVVar5 = p->vCos;
  iVar4 = pVVar5->nSize;
  if (iVar2 < iVar4) {
    lVar7 = 0;
    do {
      if (iVar4 <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar5->pArray[lVar7];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return vNodes;
      }
      if (((uint)lVar7 & 1) == iSide) {
        pGVar1 = p->pObjs + iVar4;
        Gia_ManCollectOneSide_rec
                  (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vNodes);
        iVar2 = p->nRegs;
        pVVar5 = p->vCos;
      }
      lVar7 = lVar7 + 1;
      iVar4 = pVVar5->nSize;
    } while (lVar7 < iVar4 - iVar2);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManCollectOneSide( Gia_Man_t * p, int iSide )
{
    Gia_Obj_t * pObj; int i;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachPo( p, pObj, i )
        if ( (i & 1) == iSide )
            Gia_ManCollectOneSide_rec( p, Gia_ObjFanin0(pObj), vNodes );
    return vNodes;
}